

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall KktCheck::makeARCopy(KktCheck *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer piVar2;
  int *piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_45;
  value_type local_44;
  vector<int,_std::allocator<int>_> local_40;
  
  this->tol = 1e-05;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,(long)this->numRow,&local_44,&local_45);
  this_00 = &this->ARstart;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->numRow + 1,&local_44);
  iVar8 = (int)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,(long)iVar8);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,(long)iVar8);
  this->k = 0;
  if (0 < iVar8) {
    piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = 0;
    do {
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar2[iVar7]] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar2[iVar7]] + 1;
      iVar7 = this->k + 1;
      this->k = iVar7;
    } while (iVar7 < iVar8);
  }
  this->i = 1;
  if (this->numRow < 1) {
    this->i = 0;
  }
  else {
    piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = 1;
    do {
      lVar9 = (long)iVar8;
      piVar2[lVar9] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar9 + -1] + piVar2[lVar9 + -1];
      iVar7 = this->i;
      iVar8 = iVar7 + 1;
      this->i = iVar8;
    } while (iVar7 < this->numRow);
    this->i = 0;
    if (0 < this->numRow) {
      piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = 0;
      do {
        local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8] = piVar2[iVar8];
        iVar8 = this->i + 1;
        this->i = iVar8;
      } while (iVar8 < this->numRow);
    }
  }
  iVar8 = this->numCol;
  if (0 < iVar8) {
    piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = *piVar3;
    lVar9 = 0;
    do {
      lVar10 = lVar9 + 1;
      this->k = iVar7;
      iVar1 = piVar3[lVar9 + 1];
      if (iVar7 < piVar3[lVar9 + 1]) {
        do {
          iVar8 = piVar2[iVar7];
          iVar1 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar8];
          local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar8] = iVar1 + 1;
          piVar4[iVar1] = (int)lVar9;
          iVar7 = this->k;
          pdVar6[iVar1] = pdVar5[iVar7];
          iVar7 = iVar7 + 1;
          this->k = iVar7;
        } while (iVar7 < piVar3[lVar10]);
        iVar8 = this->numCol;
        iVar1 = piVar3[lVar10];
      }
      iVar7 = iVar1;
      lVar9 = lVar10;
    } while (lVar10 < iVar8);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KktCheck::makeARCopy() {
	tol = 0.00001;
	// Make a AR copy
	vector<int> iwork(numRow, 0);
	ARstart.resize(numRow + 1, 0);
	int AcountX = Aindex.size();
	ARindex.resize(AcountX);
	ARvalue.resize(AcountX);
	for (k = 0; k < AcountX; k++)
	    iwork[Aindex[k]]++;
	for (i = 1; i <= numRow; i++)
	    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
	for (i = 0; i < numRow; i++)
	    iwork[i] = ARstart[i];
	for (int iCol = 0; iCol < numCol; iCol++) {
	    for (k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	        int iRow = Aindex[k];
	        int iPut = iwork[iRow]++;
	        ARindex[iPut] = iCol;
	        ARvalue[iPut] = Avalue[k];
	    }
	}
}